

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxels.cpp
# Opt level: O3

void R_InitVoxels(void)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  FVoxel *pFVar5;
  FVoxelDef *def;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  int j;
  ulong in_XMM1_Qb;
  TArray<unsigned_int,_unsigned_int> vsprites;
  int lastlump;
  FScanner sc;
  TArray<unsigned_int,_unsigned_int> local_168;
  double local_158;
  int local_14c;
  double local_148;
  ulong uStack_140;
  FScanner local_130;
  
  local_14c = 0;
  iVar3 = FWadCollection::FindLump(&Wads,"VOXELDEF",&local_14c,false);
  if (iVar3 != -1) {
    do {
      FScanner::FScanner(&local_130,iVar3);
      local_168.Array = (uint *)0x0;
      local_168.Most = 0;
      local_168.Count = 0;
      uVar8 = 0;
LAB_0051599f:
      if ((int)uVar8 != 0) {
        local_168._8_8_ = local_168._8_8_ & 0xffffffff;
      }
      bVar1 = FScanner::GetString(&local_130);
      while (pcVar9 = local_130.String, bVar1 != false) {
        if (*local_130.String == '=') {
          if (local_168.Count != 0) goto LAB_00515aa5;
          bVar1 = true;
          pcVar9 = "No sprites specified for voxel.\n";
          goto LAB_00515a92;
        }
        if ((local_130.StringLen & 0xfffffffeU) == 4) {
          uVar6 = 0xff000000;
          if (local_130.StringLen == 5) {
            iVar3 = toupper((int)local_130.String[4]);
            pcVar9[4] = (char)iVar3;
            if ((byte)(local_130.String[4] + 0xa2U) < 0xe3) {
              FScanner::ScriptMessage(&local_130,"Sprite frame %c is invalid.\n");
              goto LAB_00515a71;
            }
            if (local_130.StringLen != 4) {
              uVar6 = local_130.String[4] * 0x1000000 + 0xbf000000;
            }
          }
          uVar4 = GetSpriteIndex(local_130.String,false);
          if (uVar4 != 0xffffffff) {
            TArray<unsigned_int,_unsigned_int>::Grow(&local_168,1);
            local_168.Array[local_168.Count] = uVar4 | uVar6;
            local_168.Count = local_168.Count + 1;
          }
        }
        else {
          FScanner::ScriptMessage(&local_130,"Sprite name \"%s\" is wrong size.\n",local_130.String)
          ;
        }
LAB_00515a71:
        bVar1 = FScanner::GetString(&local_130);
      }
      if (local_168.Count != 0) {
        bVar1 = false;
        pcVar9 = "Unexpected end of file\n";
LAB_00515a92:
        FScanner::ScriptMessage(&local_130,pcVar9);
        if (!bVar1) goto LAB_00515f57;
LAB_00515aa5:
        FScanner::SetCMode(&local_130,true);
        FScanner::MustGetToken(&local_130,0x102);
        iVar3 = FWadCollection::CheckNumForFullName(&Wads,local_130.String,true,0xb);
        pcVar9 = "Voxel \"%s\" not found.\n";
        if (iVar3 < 0) {
LAB_00515b4e:
          FScanner::ScriptMessage(&local_130,pcVar9,local_130.String);
          pFVar5 = (FVoxel *)0x0;
        }
        else {
          if ((ulong)Voxels.super_TArray<FVoxel_*,_FVoxel_*>.Count != 0) {
            uVar8 = 0;
            do {
              pFVar5 = Voxels.super_TArray<FVoxel_*,_FVoxel_*>.Array[uVar8];
              if (pFVar5->LumpNum == iVar3) goto LAB_00515b60;
              uVar8 = uVar8 + 1;
            } while (Voxels.super_TArray<FVoxel_*,_FVoxel_*>.Count != uVar8);
          }
          pFVar5 = R_LoadKVX(iVar3);
          pcVar9 = "\"%s\" is not a valid voxel file.\n";
          if (pFVar5 == (FVoxel *)0x0) goto LAB_00515b4e;
          TArray<FVoxel_*,_FVoxel_*>::Grow(&Voxels.super_TArray<FVoxel_*,_FVoxel_*>,1);
          Voxels.super_TArray<FVoxel_*,_FVoxel_*>.Array
          [Voxels.super_TArray<FVoxel_*,_FVoxel_*>.Count] = pFVar5;
          Voxels.super_TArray<FVoxel_*,_FVoxel_*>.Count =
               Voxels.super_TArray<FVoxel_*,_FVoxel_*>.Count + 1;
        }
LAB_00515b60:
        bVar2 = FScanner::CheckToken(&local_130,0x7b);
        iVar3 = 0;
        local_148 = 90.0;
        uStack_140 = 0;
        local_158 = 1.0;
        iVar7 = 0;
        bVar1 = false;
        if (bVar2) {
          bVar2 = FScanner::GetToken(&local_130);
          iVar3 = 0;
          local_148 = 90.0;
          uStack_140 = 0;
          local_158 = 1.0;
          iVar7 = 0;
          bVar1 = false;
          if (bVar2) {
            iVar3 = 0;
            local_148 = 90.0;
            uStack_140 = 0;
            local_158 = 1.0;
            iVar7 = 0;
            bVar1 = false;
            uVar8 = in_XMM1_Qb;
            do {
              in_XMM1_Qb = uVar8;
              if (local_130.TokenType == 0x7d) goto LAB_00515e41;
              FScanner::TokenMustBe(&local_130,0x101);
              bVar2 = FScanner::Compare(&local_130,"scale");
              if (bVar2) {
                FScanner::MustGetToken(&local_130,0x3d);
                FScanner::MustGetToken(&local_130,0x106);
                local_158 = local_130.Float;
                in_XMM1_Qb = uVar8;
              }
              else {
                bVar2 = FScanner::Compare(&local_130,"spin");
                if (bVar2) {
                  FScanner::MustGetToken(&local_130,0x3d);
                  bVar2 = FScanner::CheckToken(&local_130,0x2d);
                  FScanner::MustGetToken(&local_130,0x104);
                  in_XMM1_Qb = uVar8;
                  iVar3 = -local_130.Number;
                  iVar7 = -local_130.Number;
                  if (!bVar2) {
                    iVar3 = local_130.Number;
                    iVar7 = local_130.Number;
                  }
                }
                else {
                  bVar2 = FScanner::Compare(&local_130,"placedspin");
                  if (bVar2) {
                    FScanner::MustGetToken(&local_130,0x3d);
                    bVar2 = FScanner::CheckToken(&local_130,0x2d);
                    FScanner::MustGetToken(&local_130,0x104);
                    in_XMM1_Qb = uVar8;
                    iVar3 = -local_130.Number;
                    if (!bVar2) {
                      iVar3 = local_130.Number;
                    }
                  }
                  else {
                    bVar2 = FScanner::Compare(&local_130,"droppedspin");
                    if (bVar2) {
                      FScanner::MustGetToken(&local_130,0x3d);
                      bVar2 = FScanner::CheckToken(&local_130,0x2d);
                      FScanner::MustGetToken(&local_130,0x104);
                      in_XMM1_Qb = uVar8;
                      iVar7 = -local_130.Number;
                      if (!bVar2) {
                        iVar7 = local_130.Number;
                      }
                    }
                    else {
                      bVar2 = FScanner::Compare(&local_130,"angleoffset");
                      if (bVar2) {
                        FScanner::MustGetToken(&local_130,0x3d);
                        bVar2 = FScanner::CheckToken(&local_130,0x2d);
                        FScanner::MustGetAnyToken(&local_130);
                        in_XMM1_Qb = uVar8;
                        if (local_130.TokenType == 0x104) {
                          local_130.Float = (double)local_130.Number;
                        }
                        else {
                          FScanner::TokenMustBe(&local_130,0x106);
                          uVar8 = 0;
                        }
                        local_148 = local_130.Float;
                        if (bVar2) {
                          local_148 = -local_130.Float;
                          uVar8 = uVar8 ^ 0x8000000000000000;
                        }
                        local_148 = local_148 + 90.0;
                        uStack_140 = uVar8;
                      }
                      else {
                        bVar2 = FScanner::Compare(&local_130,"overridepalette");
                        if (bVar2) {
                          bVar1 = true;
                          in_XMM1_Qb = uVar8;
                        }
                        else {
                          FScanner::ScriptMessage
                                    (&local_130,"Unknown voxel option \'%s\'\n",local_130.String);
                          bVar2 = FScanner::CheckToken(&local_130,0x3d);
                          in_XMM1_Qb = uVar8;
                          if (bVar2) {
                            FScanner::MustGetAnyToken(&local_130);
                            in_XMM1_Qb = uVar8;
                          }
                        }
                      }
                    }
                  }
                }
              }
              bVar2 = FScanner::GetToken(&local_130);
              uVar8 = in_XMM1_Qb;
            } while (bVar2);
          }
          FScanner::ScriptMessage(&local_130,"Unterminated voxel option block\n");
        }
LAB_00515e41:
        FScanner::SetCMode(&local_130,false);
        uVar8 = (ulong)local_168.Count;
        if (local_168.Count != 0 && pFVar5 != (FVoxel *)0x0) {
          if ((bVar1) && (pFVar5->Palette != (BYTE *)0x0)) {
            operator_delete__(pFVar5->Palette);
            pFVar5->Palette = (BYTE *)0x0;
          }
          def = (FVoxelDef *)operator_new(0x28);
          def->Voxel = pFVar5;
          def->Scale = local_158;
          def->DroppedSpin = iVar7;
          def->PlacedSpin = iVar3;
          (def->AngleOffset).Degrees = local_148;
          TArray<FVoxelDef_*,_FVoxelDef_*>::Grow
                    (&VoxelDefs.super_TArray<FVoxelDef_*,_FVoxelDef_*>,1);
          VoxelDefs.super_TArray<FVoxelDef_*,_FVoxelDef_*>.Array
          [VoxelDefs.super_TArray<FVoxelDef_*,_FVoxelDef_*>.Count] = def;
          VoxelDefs.super_TArray<FVoxelDef_*,_FVoxelDef_*>.Count =
               VoxelDefs.super_TArray<FVoxelDef_*,_FVoxelDef_*>.Count + 1;
          uVar8 = 0;
          if (local_168.Count != 0) {
            uVar10 = 0;
            do {
              uVar4 = local_168.Array[uVar10] & 0xffffff;
              uVar6 = local_168.Array[uVar10] >> 0x18;
              if (uVar6 == 0xff) {
                iVar3 = 0x1c;
                do {
                  VOX_AddVoxel(uVar4,iVar3,def);
                  bVar1 = iVar3 != 0;
                  iVar3 = iVar3 + -1;
                } while (bVar1);
              }
              else {
                VOX_AddVoxel(uVar4,uVar6,def);
              }
              uVar10 = uVar10 + 1;
              uVar8 = (ulong)local_168._8_8_ >> 0x20;
            } while (uVar10 < uVar8);
          }
        }
        goto LAB_0051599f;
      }
LAB_00515f57:
      TArray<unsigned_int,_unsigned_int>::~TArray(&local_168);
      FScanner::~FScanner(&local_130);
      iVar3 = FWadCollection::FindLump(&Wads,"VOXELDEF",&local_14c,false);
    } while (iVar3 != -1);
  }
  return;
}

Assistant:

void R_InitVoxels()
{
	int lump, lastlump = 0;
	
	while ((lump = Wads.FindLump("VOXELDEF", &lastlump)) != -1)
	{
		FScanner sc(lump);
		TArray<DWORD> vsprites;

		while (VOX_ReadSpriteNames(sc, vsprites))
		{
			FVoxel *voxeldata = NULL;
			int voxelfile;
			VoxelOptions opts;

			sc.SetCMode(true);
			sc.MustGetToken(TK_StringConst);
			voxelfile = Wads.CheckNumForFullName(sc.String, true, ns_voxels);
			if (voxelfile < 0)
			{
				sc.ScriptMessage("Voxel \"%s\" not found.\n", sc.String);
			}
			else
			{
				voxeldata = VOX_GetVoxel(voxelfile);
				if (voxeldata == NULL)
				{
					sc.ScriptMessage("\"%s\" is not a valid voxel file.\n", sc.String);
				}
			}
			if (sc.CheckToken('{'))
			{
				VOX_ReadOptions(sc, opts);
			}
			sc.SetCMode(false);
			if (voxeldata != NULL && vsprites.Size() != 0)
			{
				if (opts.OverridePalette)
				{
					voxeldata->RemovePalette();
				}
				FVoxelDef *def = new FVoxelDef;

				def->Voxel = voxeldata;
				def->Scale = opts.Scale;
				def->DroppedSpin = opts.DroppedSpin;
				def->PlacedSpin = opts.PlacedSpin;
				def->AngleOffset = opts.AngleOffset;
				VoxelDefs.Push(def);

				for (unsigned i = 0; i < vsprites.Size(); ++i)
				{
					int sprnum = int(vsprites[i] & 0xFFFFFF);
					int frame = int(vsprites[i] >> 24);
					if (frame == 255)
					{ // Apply voxel to all frames.
						for (int j = MAX_SPRITE_FRAMES - 1; j >= 0; --j)
						{
							VOX_AddVoxel(sprnum, j, def);
						}
					}
					else
					{ // Apply voxel to only one frame.
						VOX_AddVoxel(sprnum, frame, def);
					}
				}
			}
		}
	}
}